

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O1

Var Js::JavascriptMath::Subtract_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Type TVar4;
  Var pvVar5;
  Var aValue;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  Type TVar8;
  double value;
  
  pvVar5 = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aLeft,scriptContext);
  aValue = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aRight,scriptContext);
  if (pvVar5 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00aad005;
    *puVar6 = 0;
  }
  if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aad005;
    *puVar6 = 0;
  }
  TVar4 = TypeIds_FirstNumberType;
  if ((((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) &&
     (TVar4 = TypeIds_Number, (ulong)pvVar5 >> 0x32 == 0)) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar5);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00aad005;
      *puVar6 = 0;
    }
    TVar4 = ((pRVar7->type).ptr)->typeId;
    if ((0x57 < (int)TVar4) && (BVar3 = RecyclableObject::IsExternal(pRVar7), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00aad005;
      *puVar6 = 0;
    }
  }
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00aad005;
    *puVar6 = 0;
  }
  if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aad005;
    *puVar6 = 0;
  }
  TVar8 = TypeIds_FirstNumberType;
  if ((((ulong)aValue & 0xffff000000000000) != 0x1000000000000) &&
     (TVar8 = TypeIds_Number, (ulong)aValue >> 0x32 == 0)) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00aad005;
      *puVar6 = 0;
    }
    TVar8 = ((pRVar7->type).ptr)->typeId;
    if ((0x57 < (int)TVar8) && (BVar3 = RecyclableObject::IsExternal(pRVar7), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00aad005:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
  if ((TVar4 != TypeIds_BigInt) && (TVar8 != TypeIds_BigInt)) {
    value = Subtract_Helper(pvVar5,aValue,scriptContext);
    pvVar5 = JavascriptNumber::ToVarIntCheck(value,scriptContext);
    return pvVar5;
  }
  if (TVar8 != TVar4) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fff3,L"Subtract BigInt");
  }
  pvVar5 = JavascriptBigInt::Sub(pvVar5,aValue);
  return pvVar5;
}

Assistant:

Var JavascriptMath::Subtract_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Subtract_Full);

            Var aLeftToPrim = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aLeft, scriptContext);
            Var aRightToPrim = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);

            Js::TypeId typeLeft = JavascriptOperators::GetTypeId(aLeftToPrim);
            Js::TypeId typeRight = JavascriptOperators::GetTypeId(aRightToPrim);

            if (typeLeft == TypeIds_BigInt || typeRight == TypeIds_BigInt)
            {
                if (typeRight != typeLeft)
                {
                    JavascriptError::ThrowTypeError(scriptContext, VBSERR_TypeMismatch, _u("Subtract BigInt"));
                }
                return JavascriptBigInt::Sub(aLeftToPrim, aRightToPrim);
            }

            double difference = Subtract_Helper(aLeftToPrim, aRightToPrim, scriptContext);
            return JavascriptNumber::ToVarIntCheck(difference, scriptContext);
            JIT_HELPER_END(Op_Subtract_Full);
        }